

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_nister_main
               (Matrix<double,_9,_4,_0,_9,_4> *EE,essentials_t *essentials)

{
  size_type sVar1;
  Scalar *pSVar2;
  __type _Var3;
  double dVar4;
  essential_t essential;
  size_t c_2;
  size_t c_1;
  size_t r_1;
  size_t i_1;
  MatrixXd EvecNorms;
  int r;
  size_t c;
  MatrixXd norms;
  double y;
  double x;
  double z;
  size_t i;
  MatrixXd Evec;
  vector<double,_std::allocator<double>_> roots;
  Sturm sturmSequence;
  Matrix<double,_1,_11,_1,_1,_11> p_order10;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part3;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part2;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part1;
  Matrix<double,_1,_7,_1,_1,_7> p3;
  Matrix<double,_1,_7,_1,_1,_7> p3_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part1;
  Matrix<double,_1,_8,_1,_1,_8> p2;
  Matrix<double,_1,_8,_1,_1,_8> p2_part2;
  Matrix<double,_1,_8,_1,_1,_8> p2_part1;
  Matrix<double,_1,_8,_1,_1,_8> p1;
  Matrix<double,_1,_8,_1,_1,_8> p1_part2;
  Matrix<double,_1,_8,_1,_1,_8> p1_part1;
  Matrix<double,_1,_5,_1,_1,_5> b33;
  Matrix<double,_1,_5,_1,_1,_5> b33_part2;
  Matrix<double,_1,_5,_1,_1,_5> b33_part1;
  Matrix<double,_1,_5,_1,_1,_5> b23;
  Matrix<double,_1,_5,_1,_1,_5> b23_part2;
  Matrix<double,_1,_5,_1,_1,_5> b23_part1;
  Matrix<double,_1,_5,_1,_1,_5> b13;
  Matrix<double,_1,_5,_1,_1,_5> b13_part2;
  Matrix<double,_1,_5,_1,_1,_5> b13_part1;
  Matrix<double,_1,_4,_1,_1,_4> b32;
  Matrix<double,_1,_4,_1,_1,_4> b32_part2;
  Matrix<double,_1,_4,_1,_1,_4> b32_part1;
  Matrix<double,_1,_4,_1,_1,_4> b22;
  Matrix<double,_1,_4,_1,_1,_4> b22_part2;
  Matrix<double,_1,_4,_1,_1,_4> b22_part1;
  Matrix<double,_1,_4,_1,_1,_4> b12;
  Matrix<double,_1,_4,_1,_1,_4> b12_part2;
  Matrix<double,_1,_4,_1,_1,_4> b12_part1;
  Matrix<double,_1,_4,_1,_1,_4> b31;
  Matrix<double,_1,_4,_1,_1,_4> b31_part2;
  Matrix<double,_1,_4,_1,_1,_4> b31_part1;
  Matrix<double,_1,_4,_1,_1,_4> b21;
  Matrix<double,_1,_4,_1,_1,_4> b21_part2;
  Matrix<double,_1,_4,_1,_1,_4> b21_part1;
  Matrix<double,_1,_4,_1,_1,_4> b11;
  Matrix<double,_1,_4,_1,_1,_4> b11_part2;
  Matrix<double,_1,_4,_1,_1,_4> b11_part1;
  Matrix<double,_10,_10,_0,_10,_10> A3;
  FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> luA1;
  Matrix<double,_10,_10,_0,_10,_10> A2;
  Matrix<double,_10,_10,_0,_10,_10> A1;
  Matrix<double,_10,_20,_0,_10,_20> A;
  undefined4 in_stack_ffffffffffffc7c0;
  int in_stack_ffffffffffffc7c4;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffc7c8;
  value_type *in_stack_ffffffffffffc7d0;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffc7d8;
  MatrixBase<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>_>
  *in_stack_ffffffffffffc7e0;
  MatrixBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> *in_stack_ffffffffffffc7e8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>_>_>
  *in_stack_ffffffffffffc7f0;
  ulong uVar5;
  Index in_stack_ffffffffffffc7f8;
  EigenBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *in_stack_ffffffffffffc800;
  FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *in_stack_ffffffffffffc808;
  Scalar SVar6;
  double *in_stack_ffffffffffffc810;
  Matrix<double,_1,_7,_1,_1,_7> *p_out;
  Matrix<double,_1,_4,_1,_1,_4> *p2_00;
  Matrix<double,_1,_4,_1,_1,_4> *in_stack_ffffffffffffc8d8;
  Matrix<double,_1,_8,_1,_1,_8> *in_stack_ffffffffffffc908;
  Matrix<double,_1,_4,_1,_1,_4> *in_stack_ffffffffffffc910;
  Matrix<double,_1,_5,_1,_1,_5> *in_stack_ffffffffffffc918;
  Sturm *in_stack_ffffffffffffc9a0;
  Sturm *in_stack_ffffffffffffc9a8;
  Matrix<double,_1,_11,_1,_1,_11> *in_stack_ffffffffffffc9c8;
  Matrix<double,_1,_4,_1,_1,_4> *in_stack_ffffffffffffc9d0;
  Matrix<double,_1,_8,_1,_1,_8> *in_stack_ffffffffffffc9d8;
  double *in_stack_ffffffffffffc9e0;
  double *in_stack_ffffffffffffc9e8;
  double *in_stack_ffffffffffffc9f0;
  Matrix<double,_10,_20,_0,_10,_20> *in_stack_ffffffffffffc9f8;
  Matrix<double,_1,_5,_1,_1,_5> *in_stack_ffffffffffffca00;
  Matrix<double,_1,_7,_1,_1,_7> *in_stack_ffffffffffffca08;
  ulong local_3530;
  ulong local_3528;
  ulong local_3520;
  ulong local_34e0;
  int local_34ac;
  ulong local_34a8;
  ulong local_2f08;
  vector<double,_std::allocator<double>_> local_2ed8 [2];
  Matrix<double,_10,_20,_0,_10,_20> *in_stack_ffffffffffffd160;
  Matrix<double,_9,_4,_0,_9,_4> *in_stack_ffffffffffffd168;
  Matrix<double,_1,_4,_1,_1,_4> local_1180 [61];
  Matrix<double,_1,_7,_1,_1,_7> local_9e0 [45];
  
  Eigen::Matrix<double,_10,_20,_0,_10,_20>::Matrix((Matrix<double,_10,_20,_0,_10,_20> *)0xcdc914);
  fivept_nister::composeA(in_stack_ffffffffffffd168,in_stack_ffffffffffffd160);
  Eigen::DenseBase<Eigen::Matrix<double,10,20,0,10,20>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_> *)in_stack_ffffffffffffc808,
             (Index)in_stack_ffffffffffffc800,in_stack_ffffffffffffc7f8,
             (int)((ulong)in_stack_ffffffffffffc7f0 >> 0x20),(int)in_stack_ffffffffffffc7f0);
  p_out = local_9e0;
  Eigen::Matrix<double,10,10,0,10,10>::
  Matrix<Eigen::Block<Eigen::Matrix<double,10,20,0,10,20>,_1,_1,false>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,_10,_20,_0,_10,_20>,__1,__1,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,20,0,10,20>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_> *)in_stack_ffffffffffffc808,
             (Index)in_stack_ffffffffffffc800,in_stack_ffffffffffffc7f8,
             (int)((ulong)in_stack_ffffffffffffc7f0 >> 0x20),(int)in_stack_ffffffffffffc7f0);
  Eigen::Matrix<double,10,10,0,10,10>::
  Matrix<Eigen::Block<Eigen::Matrix<double,10,20,0,10,20>,_1,_1,false>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,_10,_20,_0,_10,_20>,__1,__1,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  p2_00 = local_1180;
  Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>::
  FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>
            (in_stack_ffffffffffffc808,in_stack_ffffffffffffc800);
  Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::inverse
            ((FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>>>::
  operator*(in_stack_ffffffffffffc7e0,
            (MatrixBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8);
  Eigen::Matrix<double,10,10,0,10,10>::
  Matrix<Eigen::Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>>,Eigen::Matrix<double,10,10,0,10,10>,0>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::
  Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>
  ::~Product((Product<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>
              *)0xcdca44);
  Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>::~Inverse
            ((Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_> *)0xcdca51);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::Zero();
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,4,1,1,4>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,4,1,1,4>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1,_3,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_3,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,4,1,1,4>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,4,1,1,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,4,1,1,4>const,Eigen::Matrix<double,1,4,1,1,4>const>>
            ((Matrix<double,_1,_4,_1,_1,_4> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,5,1,1,5>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,5,1,1,5>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::Zero();
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,5,1,1,5>>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::DenseBase<Eigen::Matrix<double,10,10,0,10,10>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::DenseBase<Eigen::Matrix<double,1,5,1,1,5>>::block<1,4>
            ((DenseBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7d8,
             (Index)in_stack_ffffffffffffc7d0,(Index)in_stack_ffffffffffffc7c8);
  Eigen::Block<Eigen::Matrix<double,1,5,1,1,5>,1,4,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_1,_4,_false> *)in_stack_ffffffffffffc7c8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_4,_false>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::MatrixBase<Eigen::Matrix<double,1,5,1,1,5>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,5,1,1,5>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,5,1,1,5>const,Eigen::Matrix<double,1,5,1,1,5>const>>
            ((Matrix<double,_1,_5,_1,_1,_5> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::Matrix<double,_1,_8,_1,_1,_8>::Matrix((Matrix<double,_1,_8,_1,_1,_8> *)0xcdd506);
  fivept_nister::computeSeventhOrderPolynomial
            (in_stack_ffffffffffffc918,in_stack_ffffffffffffc910,in_stack_ffffffffffffc908);
  Eigen::Matrix<double,_1,_8,_1,_1,_8>::Matrix((Matrix<double,_1,_8,_1,_1,_8> *)0xcdd534);
  fivept_nister::computeSeventhOrderPolynomial
            (in_stack_ffffffffffffc918,in_stack_ffffffffffffc910,in_stack_ffffffffffffc908);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,8,1,1,8>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::Matrix<double,1,8,1,1,8>const>>
            ((Matrix<double,_1,_8,_1,_1,_8> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::Matrix<double,_1,_8,_1,_1,_8>::Matrix((Matrix<double,_1,_8,_1,_1,_8> *)0xcdd598);
  fivept_nister::computeSeventhOrderPolynomial
            (in_stack_ffffffffffffc918,in_stack_ffffffffffffc910,in_stack_ffffffffffffc908);
  Eigen::Matrix<double,_1,_8,_1,_1,_8>::Matrix((Matrix<double,_1,_8,_1,_1,_8> *)0xcdd5c6);
  fivept_nister::computeSeventhOrderPolynomial
            (in_stack_ffffffffffffc918,in_stack_ffffffffffffc910,in_stack_ffffffffffffc908);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,8,1,1,8>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::Matrix<double,1,8,1,1,8>const>>
            ((Matrix<double,_1,_8,_1,_1,_8> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::Matrix<double,_1,_7,_1,_1,_7>::Matrix((Matrix<double,_1,_7,_1,_1,_7> *)0xcdd62a);
  fivept_nister::computeSixthOrderPolynomial(in_stack_ffffffffffffc8d8,p2_00,p_out);
  Eigen::Matrix<double,_1,_7,_1,_1,_7>::Matrix((Matrix<double,_1,_7,_1,_1,_7> *)0xcdd658);
  fivept_nister::computeSixthOrderPolynomial(in_stack_ffffffffffffc8d8,p2_00,p_out);
  Eigen::MatrixBase<Eigen::Matrix<double,1,7,1,1,7>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)in_stack_ffffffffffffc7f0,
             (MatrixBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,7,1,1,7>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,7,1,1,7>const,Eigen::Matrix<double,1,7,1,1,7>const>>
            ((Matrix<double,_1,_7,_1,_1,_7> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_7,_1,_1,_7>,_const_Eigen::Matrix<double,_1,_7,_1,_1,_7>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::Matrix<double,_1,_11,_1,_1,_11>::Matrix((Matrix<double,_1,_11,_1,_1,_11> *)0xcdd6bc);
  fivept_nister::computeTenthOrderPolynomialFrom73
            (in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,in_stack_ffffffffffffc9c8);
  Eigen::Matrix<double,_1,_11,_1,_1,_11>::Matrix((Matrix<double,_1,_11,_1,_1,_11> *)0xcdd6ea);
  fivept_nister::computeTenthOrderPolynomialFrom73
            (in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0,in_stack_ffffffffffffc9c8);
  Eigen::Matrix<double,_1,_11,_1,_1,_11>::Matrix((Matrix<double,_1,_11,_1,_1,_11> *)0xcdd718);
  fivept_nister::computeTenthOrderPolynomialFrom64
            (in_stack_ffffffffffffca08,in_stack_ffffffffffffca00,
             (Matrix<double,_1,_11,_1,_1,_11> *)in_stack_ffffffffffffc9f8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,11,1,1,11>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> *)in_stack_ffffffffffffc7f0,
             in_stack_ffffffffffffc7e8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,11,1,1,11>const,Eigen::Matrix<double,1,11,1,1,11>const>>
  ::operator+(in_stack_ffffffffffffc7f0,in_stack_ffffffffffffc7e8);
  Eigen::Matrix<double,1,11,1,1,11>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,11,1,1,11>const,Eigen::Matrix<double,1,11,1,1,11>const>const,Eigen::Matrix<double,1,11,1,1,11>const>>
            ((Matrix<double,_1,_11,_1,_1,_11> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>_>,_const_Eigen::Matrix<double,_1,_11,_1,_1,_11>_>_>
              *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,11,1,1,11>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7c8,
             (EigenBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_> *)
             CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  math::Sturm::Sturm(in_stack_ffffffffffffc9a8,(MatrixXd *)in_stack_ffffffffffffc9a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcdd7c9);
  math::Sturm::findRoots(in_stack_ffffffffffffc9a0);
  std::vector<double,_std::allocator<double>_>::size(local_2ed8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7e8,
             (int *)in_stack_ffffffffffffc7e0,(unsigned_long *)in_stack_ffffffffffffc7d8);
  local_2f08 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_2ed8);
    if (sVar1 <= local_2f08) break;
    std::vector<double,_std::allocator<double>_>::operator[](local_2ed8,local_2f08);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,8,1,1,8>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7c8,
               (EigenBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)
               CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    fivept_nister::polyVal((MatrixXd *)in_stack_ffffffffffffc7e8,(double)in_stack_ffffffffffffc7e0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,7,1,1,7>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7c8,
               (EigenBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)
               CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    fivept_nister::polyVal((MatrixXd *)in_stack_ffffffffffffc7e8,(double)in_stack_ffffffffffffc7e0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcdd91a)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcdd927)
    ;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,8,1,1,8>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7c8,
               (EigenBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)
               CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    fivept_nister::polyVal((MatrixXd *)in_stack_ffffffffffffc7e8,(double)in_stack_ffffffffffffc7e0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,7,1,1,7>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7c8,
               (EigenBase<Eigen::Matrix<double,_1,_7,_1,_1,_7>_> *)
               CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    fivept_nister::polyVal((MatrixXd *)in_stack_ffffffffffffc7e8,(double)in_stack_ffffffffffffc7e0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcdd9d5)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcdd9e2)
    ;
    fivept_nister::pollishCoefficients
              (in_stack_ffffffffffffc9f8,in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8,
               in_stack_ffffffffffffc9e0);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::operator*(in_stack_ffffffffffffc810,(StorageBaseType *)in_stack_ffffffffffffc808);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::operator*(in_stack_ffffffffffffc810,(StorageBaseType *)in_stack_ffffffffffffc808);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>
                 *)in_stack_ffffffffffffc7f0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>
                 *)in_stack_ffffffffffffc7e8);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::operator*(in_stack_ffffffffffffc810,(StorageBaseType *)in_stack_ffffffffffffc808);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>_>
                 *)in_stack_ffffffffffffc7f0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>
                 *)in_stack_ffffffffffffc7e8);
    Eigen::DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,4,0,9,4>const,9,1,true>const>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>_>
                 *)in_stack_ffffffffffffc7f0,
                (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_> *
                )in_stack_ffffffffffffc7e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_ffffffffffffc7d8,(Index)in_stack_ffffffffffffc7d0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_ffffffffffffc7c8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_9,_4,_0,_9,_4>,_9,_1,_true>_>_>
                *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    local_2f08 = local_2f08 + 1;
  }
  std::vector<double,_std::allocator<double>_>::size(local_2ed8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7e8,
             (int *)in_stack_ffffffffffffc7e0,(unsigned_long *)in_stack_ffffffffffffc7d8);
  local_34a8 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_2ed8);
    if (sVar1 <= local_34a8) break;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffc7c8,
                        CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcddd8f);
    *pSVar2 = 0.0;
    for (local_34ac = 0; local_34ac < 9; local_34ac = local_34ac + 1) {
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                (in_stack_ffffffffffffc7c8,
                 CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcddddf);
      _Var3 = std::pow<double,int>((double)in_stack_ffffffffffffc7c8,in_stack_ffffffffffffc7c4);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffc7c8,
                          CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcdde23);
      *pSVar2 = _Var3 + *pSVar2;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffc7c8,
                        CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcdde8e);
    dVar4 = sqrt(*pSVar2);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffc7c8,
                        CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcddec2);
    *pSVar2 = dVar4;
    local_34a8 = local_34a8 + 1;
  }
  std::vector<double,_std::allocator<double>_>::size(local_2ed8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffc7e8,
             (int *)in_stack_ffffffffffffc7e0,(unsigned_long *)in_stack_ffffffffffffc7d8);
  for (local_34e0 = 0; local_34e0 < 9; local_34e0 = local_34e0 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_ffffffffffffc7d8,(Index)in_stack_ffffffffffffc7d0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               in_stack_ffffffffffffc7c8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
  }
  for (local_3520 = 0; local_3520 < 9; local_3520 = local_3520 + 1) {
    local_3528 = 0;
    while( true ) {
      sVar1 = std::vector<double,_std::allocator<double>_>::size(local_2ed8);
      if (sVar1 <= local_3528) break;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffc7c8,
                          CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcde02a);
      SVar6 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffc7c8,
                          CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcde05d);
      dVar4 = SVar6 / *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffc7c8,
                          CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0),0xcde09a);
      *pSVar2 = dVar4;
      local_3528 = local_3528 + 1;
    }
  }
  local_3530 = 0;
  while( true ) {
    uVar5 = local_3530;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_2ed8);
    if (sVar1 <= uVar5) break;
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xcde128);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>
              (in_stack_ffffffffffffc7d8,(Index)in_stack_ffffffffffffc7d0,
               (Index)in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
              in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_ffffffffffffc7c8
               ,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_>_>
                 *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>
              (in_stack_ffffffffffffc7d8,(Index)in_stack_ffffffffffffc7d0,
               (Index)in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
              in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_ffffffffffffc7c8
               ,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_>_>
                 *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>
              (in_stack_ffffffffffffc7d8,(Index)in_stack_ffffffffffffc7d0,
               (Index)in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
              in_stack_ffffffffffffc7c8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffc7d8,
               (Index)in_stack_ffffffffffffc7d0);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_ffffffffffffc7c8
               ,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_>_>
                 *)CONCAT44(in_stack_ffffffffffffc7c4,in_stack_ffffffffffffc7c0));
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_ffffffffffffc7d8,in_stack_ffffffffffffc7d0);
    local_3530 = local_3530 + 1;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcde2b1);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcde2be);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcde2cb);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffc7d8);
  math::Sturm::~Sturm((Sturm *)0xcde2e5);
  Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::~FullPivLU
            ((FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)0xcde2f2);
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister_main(
    const Eigen::Matrix<double,9,4> & EE,
    essentials_t & essentials )
{
  Eigen::Matrix<double,10,20> A;
  fivept_nister::composeA(EE,A);

  Eigen::Matrix<double,10,10> A1 = A.block(0,0,10,10);
  Eigen::Matrix<double,10,10> A2 = A.block(0,10,10,10);

  Eigen::FullPivLU< Eigen::Matrix<double,10,10> > luA1(A1);
  Eigen::Matrix<double,10,10> A3 = luA1.inverse()*A2;

  Eigen::Matrix<double,1,4> b11_part1 = Eigen::Matrix<double,1,4>::Zero();
  b11_part1.block<1,3>(0,1) = A3.block<1,3>(4,0);
  Eigen::Matrix<double,1,4> b11_part2 = Eigen::Matrix<double,1,4>::Zero();
  b11_part2.block<1,3>(0,0) = A3.block<1,3>(5,0);
  Eigen::Matrix<double,1,4> b11 = b11_part1 - b11_part2;

  Eigen::Matrix<double,1,4> b21_part1 = Eigen::Matrix<double,1,4>::Zero();
  b21_part1.block<1,3>(0,1) = A3.block<1,3>(6,0);
  Eigen::Matrix<double,1,4> b21_part2 = Eigen::Matrix<double,1,4>::Zero();
  b21_part2.block<1,3>(0,0) = A3.block<1,3>(7,0);
  Eigen::Matrix<double,1,4> b21 = b21_part1 - b21_part2;

  Eigen::Matrix<double,1,4> b31_part1 = Eigen::Matrix<double,1,4>::Zero();
  b31_part1.block<1,3>(0,1) = A3.block<1,3>(8,0);
  Eigen::Matrix<double,1,4> b31_part2 = Eigen::Matrix<double,1,4>::Zero();
  b31_part2.block<1,3>(0,0) = A3.block<1,3>(9,0);
  Eigen::Matrix<double,1,4> b31 = b31_part1 - b31_part2;

  Eigen::Matrix<double,1,4> b12_part1 = Eigen::Matrix<double,1,4>::Zero();
  b12_part1.block<1,3>(0,1) = A3.block<1,3>(4,3);
  Eigen::Matrix<double,1,4> b12_part2 = Eigen::Matrix<double,1,4>::Zero();
  b12_part2.block<1,3>(0,0) = A3.block<1,3>(5,3);
  Eigen::Matrix<double,1,4> b12 = b12_part1 - b12_part2;

  Eigen::Matrix<double,1,4> b22_part1 = Eigen::Matrix<double,1,4>::Zero();
  b22_part1.block<1,3>(0,1) = A3.block<1,3>(6,3);
  Eigen::Matrix<double,1,4> b22_part2 = Eigen::Matrix<double,1,4>::Zero();
  b22_part2.block<1,3>(0,0) = A3.block<1,3>(7,3);
  Eigen::Matrix<double,1,4> b22 = b22_part1 - b22_part2;

  Eigen::Matrix<double,1,4> b32_part1 = Eigen::Matrix<double,1,4>::Zero();
  b32_part1.block<1,3>(0,1) = A3.block<1,3>(8,3);
  Eigen::Matrix<double,1,4> b32_part2 = Eigen::Matrix<double,1,4>::Zero();
  b32_part2.block<1,3>(0,0) = A3.block<1,3>(9,3);
  Eigen::Matrix<double,1,4> b32 = b32_part1 - b32_part2;

  Eigen::Matrix<double,1,5> b13_part1 = Eigen::Matrix<double,1,5>::Zero();
  b13_part1.block<1,4>(0,1) = A3.block<1,4>(4,6);
  Eigen::Matrix<double,1,5> b13_part2 = Eigen::Matrix<double,1,5>::Zero();
  b13_part2.block<1,4>(0,0) = A3.block<1,4>(5,6);
  Eigen::Matrix<double,1,5> b13 = b13_part1 - b13_part2;

  Eigen::Matrix<double,1,5> b23_part1 = Eigen::Matrix<double,1,5>::Zero();
  b23_part1.block<1,4>(0,1) = A3.block<1,4>(6,6);
  Eigen::Matrix<double,1,5> b23_part2 = Eigen::Matrix<double,1,5>::Zero();
  b23_part2.block<1,4>(0,0) = A3.block<1,4>(7,6);
  Eigen::Matrix<double,1,5> b23 = b23_part1 - b23_part2;

  Eigen::Matrix<double,1,5> b33_part1 = Eigen::Matrix<double,1,5>::Zero();
  b33_part1.block<1,4>(0,1) = A3.block<1,4>(8,6);
  Eigen::Matrix<double,1,5> b33_part2 = Eigen::Matrix<double,1,5>::Zero();
  b33_part2.block<1,4>(0,0) = A3.block<1,4>(9,6);
  Eigen::Matrix<double,1,5> b33 = b33_part1 - b33_part2;

  Eigen::Matrix<double,1,8> p1_part1;
  fivept_nister::computeSeventhOrderPolynomial(b23,b12,p1_part1);
  Eigen::Matrix<double,1,8> p1_part2;
  fivept_nister::computeSeventhOrderPolynomial(b13,b22,p1_part2);
  Eigen::Matrix<double,1,8> p1 = p1_part1 - p1_part2;
  Eigen::Matrix<double,1,8> p2_part1;
  fivept_nister::computeSeventhOrderPolynomial(b13,b21,p2_part1);
  Eigen::Matrix<double,1,8> p2_part2;
  fivept_nister::computeSeventhOrderPolynomial(b23,b11,p2_part2);
  Eigen::Matrix<double,1,8> p2 = p2_part1 - p2_part2;
  Eigen::Matrix<double,1,7> p3_part1;
  fivept_nister::computeSixthOrderPolynomial(b11,b22,p3_part1);
  Eigen::Matrix<double,1,7> p3_part2;
  fivept_nister::computeSixthOrderPolynomial(b12,b21,p3_part2);
  Eigen::Matrix<double,1,7> p3 = p3_part1 - p3_part2;

  Eigen::Matrix<double,1,11> p_order10_part1;
  fivept_nister::computeTenthOrderPolynomialFrom73(p1,b31,p_order10_part1);
  Eigen::Matrix<double,1,11> p_order10_part2;
  fivept_nister::computeTenthOrderPolynomialFrom73(p2,b32,p_order10_part2);
  Eigen::Matrix<double,1,11> p_order10_part3;
  fivept_nister::computeTenthOrderPolynomialFrom64(p3,b33,p_order10_part3);
  Eigen::Matrix<double,1,11> p_order10 =
      p_order10_part1 + p_order10_part2 + p_order10_part3;

  math::Sturm sturmSequence(p_order10);
  std::vector<double> roots = sturmSequence.findRoots();

  Eigen::MatrixXd Evec(9,roots.size());

  for( size_t i = 0; i < roots.size(); i++ )
  {
    double z = roots[i];
    double x = fivept_nister::polyVal(p1,z)/fivept_nister::polyVal(p3,z);
    double y = fivept_nister::polyVal(p2,z)/fivept_nister::polyVal(p3,z);

    //pollishing here
    fivept_nister::pollishCoefficients(A,x,y,z);

    Evec.col(i) = x*EE.col(0) + y*EE.col(1) + z*EE.col(2) + EE.col(3);
  }

  Eigen::MatrixXd norms(1,roots.size());
  for( size_t c = 0; c < roots.size(); c++ )
  {
    norms(0,c) = 0.0;

    for( int r = 0; r < 9; r++ )
      norms(0,c) += pow( Evec(r,c), 2 );

    norms(0,c) = sqrt(norms(0,c));
  }

  Eigen::MatrixXd EvecNorms(9,roots.size());
  for( size_t i = 0; i < 9; i++ )
    EvecNorms.row(i) = norms;

  for( size_t r = 0; r < 9; r++ )
  {
    for( size_t c = 0; c < roots.size(); c++ )
      Evec(r,c) = Evec(r,c) / EvecNorms(r,c);
  }

  for( size_t c = 0; c < roots.size(); c++ )
  {
    essential_t essential;

    essential.row(0) = Evec.block<3,1>(0,c).transpose();
    essential.row(1) = Evec.block<3,1>(3,c).transpose();
    essential.row(2) = Evec.block<3,1>(6,c).transpose();

    essentials.push_back(essential);
  }
}